

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O2

bool __thiscall CoreML::NeuralNetworkShaper::isValid(NeuralNetworkShaper *this)

{
  bool bVar1;
  _Rb_tree_header *p_Var2;
  _Self __tmp;
  _Base_ptr p_Var3;
  
  p_Var2 = &(this->blobShapes)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var3 = (this->blobShapes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var2; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    bVar1 = ShapeConstraint::isValid((ShapeConstraint *)(p_Var3 + 2));
    if (!bVar1) break;
  }
  return (_Rb_tree_header *)p_Var3 == p_Var2;
}

Assistant:

bool NeuralNetworkShaper::isValid() const {
    // TODO: make this check all of the blob names, and make it compare to the input and output shapes
    for (auto ind = blobShapes.begin(); ind != blobShapes.end(); ind++) {
        if (!(*ind).second.isValid())
            return false;
    }
    return true;
}